

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_new(ExecutionEngine *this)

{
  cp_info *constantPool;
  int iVar1;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar2;
  u1 *puVar3;
  ulong uVar4;
  char *pcVar5;
  MethodArea *this_02;
  ClassRuntime *classRuntime;
  anon_union_8_10_52016fac_for_data this_03;
  Value operand;
  string className;
  allocator local_59;
  string local_58;
  string local_38;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  ppcVar2 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar2;
  puVar3 = Frame::getCode(this_01,this_01->pc);
  uVar4 = (ulong)(ushort)(*(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8);
  if (constantPool[uVar4 - 1].tag == '\a') {
    pcVar5 = getFormattedConstant
                       (constantPool,constantPool[uVar4 - 1].info.fieldref_info.class_index);
    std::__cxx11::string::string((string *)&local_38,pcVar5,&local_59);
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) {
      this_03.object = (Object *)operator_new(0x28);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      StringObject::StringObject((StringObject *)this_03.object,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    else {
      this_02 = MethodArea::getInstance();
      classRuntime = MethodArea::loadClassNamed(this_02,&local_38);
      this_03.object = (Object *)operator_new(0x40);
      ClassInstance::ClassInstance((ClassInstance *)this_03.object,classRuntime);
    }
    operand.data.longValue = this_03.longValue;
    operand.printType = BOOLEAN;
    operand.type = REFERENCE;
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("classCP.tag == CONSTANT_Class",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x10b6,"void ExecutionEngine::i_new()");
}

Assistant:

void ExecutionEngine::i_new() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();     
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t classIndex = (byte1 << 8) | byte2;
    cp_info classCP = constantPool[classIndex-1];
    assert(classCP.tag == CONSTANT_Class);
    
    CONSTANT_Class_info classInfo = classCP.info.class_info; // Formata nome da classe
    string className = getFormattedConstant(constantPool, classInfo.name_index);

    Object *object;
    if (className == "java/lang/String") {
        object = new StringObject();
    } else {
        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        object = new ClassInstance(classRuntime); // Cria instancia da classe e coloca na heap
    }
    
    // Armazena referência na pilha
    Value objectref;
    objectref.data.object = object;
    objectref.type = ValueType::REFERENCE;
    topFrame->pushIntoOperandStack(objectref);
    
    topFrame->pc += 3;
}